

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void copy_unit_info(RestorationType frame_rtype,RestUnitSearchInfo *rusi,RestorationUnitInfo *rui)

{
  int iVar1;
  RestorationUnitInfo *rui_local;
  RestUnitSearchInfo *rusi_local;
  RestorationType frame_rtype_local;
  
  rui->restoration_type = rusi->best_rtype[frame_rtype - RESTORE_WIENER];
  if (rui->restoration_type == RESTORE_WIENER) {
    *(undefined8 *)(rui->wiener_info).vfilter = *(undefined8 *)(rusi->wiener).vfilter;
    *(undefined8 *)((rui->wiener_info).vfilter + 4) = *(undefined8 *)((rusi->wiener).vfilter + 4);
    *(undefined8 *)(rui->wiener_info).hfilter = *(undefined8 *)(rusi->wiener).hfilter;
    *(undefined8 *)((rui->wiener_info).hfilter + 4) = *(undefined8 *)((rusi->wiener).hfilter + 4);
  }
  else {
    iVar1 = (rusi->sgrproj).xqd[0];
    (rui->sgrproj_info).ep = (rusi->sgrproj).ep;
    (rui->sgrproj_info).xqd[0] = iVar1;
    (rui->sgrproj_info).xqd[1] = (rusi->sgrproj).xqd[1];
  }
  return;
}

Assistant:

static inline void copy_unit_info(RestorationType frame_rtype,
                                  const RestUnitSearchInfo *rusi,
                                  RestorationUnitInfo *rui) {
  assert(frame_rtype > 0);
  rui->restoration_type = rusi->best_rtype[frame_rtype - 1];
  if (rui->restoration_type == RESTORE_WIENER)
    rui->wiener_info = rusi->wiener;
  else
    rui->sgrproj_info = rusi->sgrproj;
}